

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_MSR_bank(DisasContext_conflict1 *s,arg_MSR_bank *a)

{
  int rn;
  int iVar1;
  int iVar2;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *pTVar3;
  _Bool _Var4;
  uintptr_t o_2;
  TCGTemp *pTVar5;
  TCGv_i32 pTVar6;
  TCGv_i32 pTVar7;
  uint uVar8;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i32 var;
  int regno;
  int tgtmode;
  int local_60;
  int local_5c;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar8 = (uint)s->features;
  if ((uVar8 >> 9 & 1) == 0) {
    rn = a->rn;
    tcg_ctx = s->uc->tcg_ctx;
    local_5c = 0;
    local_60 = 0;
    _Var4 = msr_banked_access_decode(s,a->r,a->sysm,rn,&local_5c,&local_60);
    if (_Var4) {
      iVar1 = s->condexec_mask;
      if (iVar1 != 0) {
        pTVar3 = s->uc->tcg_ctx;
        iVar2 = s->condexec_cond;
        pTVar5 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
        tcg_gen_op2_aarch64(pTVar3,INDEX_op_movi_i32,(TCGArg)pTVar5,(long)(iVar1 >> 1 | iVar2 << 4))
        ;
        tcg_gen_op3_aarch64(pTVar3,INDEX_op_st_i32,(TCGArg)pTVar5,
                            (TCGArg)(pTVar3->cpu_env + (long)pTVar3),0x224);
        tcg_temp_free_internal_aarch64(pTVar3,pTVar5);
      }
      pTVar3 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_R[0xf] + (long)pTVar3),
                          (long)(int)s->pc_curr);
      pTVar3 = s->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar5 - (long)pTVar3);
      load_reg_var(s,var,rn);
      pTVar6 = tcg_const_i32_aarch64(tcg_ctx,local_5c);
      pTVar7 = tcg_const_i32_aarch64(tcg_ctx,local_60);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pTVar5 = (TCGTemp *)(var + (long)tcg_ctx);
      local_50 = pTVar5;
      local_48 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar7 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,helper_msr_banked_aarch64,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,pTVar5);
      (s->base).is_jmp = DISAS_TARGET_1;
    }
  }
  return (uVar8 >> 9 & 1) == 0;
}

Assistant:

static bool trans_MSR_bank(DisasContext *s, arg_MSR_bank *a)
{
    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    gen_msr_banked(s, a->r, a->sysm, a->rn);
    return true;
}